

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-fight-defend.c
# Opt level: O0

wchar_t borg_defend_aux_tele_away_morgoth(void)

{
  int iVar1;
  loc grid1;
  _Bool _Var2;
  wchar_t wVar3;
  borg_kill *pbVar4;
  char *what;
  borg_kill *kill;
  borg_grid *ag;
  wchar_t i;
  wchar_t fail_allowed;
  wchar_t p2;
  
  if (borg.trait[0x69] == 100) {
    if (morgoth_on_level) {
      if (((borg.trait[0x70] == 0) && (borg.trait[0x72] == 0)) && (borg.trait[0x79] == 0)) {
        _Var2 = borg_spell_okay_fail(TELEPORT_OTHER,0x28);
        if (_Var2) {
          if (borg.trait[0xe6] < 10) {
            fail_allowed = L'\0';
          }
          else {
            _Var2 = borg_surrounded();
            if (_Var2) {
              fail_allowed = L'\0';
            }
            else if ((borg_kills_cnt == 0) && ((borg_simulate & 1U) != 0)) {
              fail_allowed = L'\0';
            }
            else {
              borg_temp_n = 0;
              borg_tp_other_n = 0;
              for (ag._0_4_ = 0; (int)ag < borg_kills_nxt; ag._0_4_ = (int)ag + 1) {
                pbVar4 = borg_kills + (int)ag;
                if (((pbVar4->r_idx != 0) && (borg_t + -2 <= (int)pbVar4->when)) &&
                   ((iVar1 = (pbVar4->pos).x, (borg_grids[(pbVar4->pos).y][iVar1].info & 8) != 0 &&
                    ((((borg_grids[(pbVar4->pos).y][iVar1].info & 0x20) != 0 &&
                      (grid1.y = borg.c.y, grid1.x = borg.c.x, wVar3 = distance(grid1,pbVar4->pos),
                      wVar3 <= (int)(uint)z_info->max_range)) &&
                     (_Var2 = borg_projectable(borg.c.y,borg.c.x,(pbVar4->pos).y,(pbVar4->pos).x),
                     _Var2)))))) {
                  borg_temp_x[borg_temp_n] = (uint8_t)(pbVar4->pos).x;
                  borg_temp_y[borg_temp_n] = (uint8_t)(pbVar4->pos).y;
                  borg_temp_n = borg_temp_n + 1;
                }
              }
              if ((borg_temp_n == 0) && ((borg_simulate & 1U) != 0)) {
                fail_allowed = L'\0';
              }
              else {
                i = borg_launch_bolt(L'\0',L'2',L'.',(uint)z_info->max_range,L'\0');
                if (L'Ϩ' < i) {
                  i = L'Ϩ';
                }
                borg_temp_n = 0;
                borg_tp_other_n = 0;
                if ((borg_simulate & 1U) == 0) {
                  borg_log_spellpath(true);
                  for (ag._0_4_ = 0; (int)ag < borg_tp_other_n; ag._0_4_ = (int)ag + 1) {
                    what = format("# %d, index %d (%d,%d)",(ulong)(uint)(int)borg_tp_other_n,
                                  (ulong)(uint)borg_tp_other_index[(int)ag],
                                  (ulong)borg_tp_other_y[(int)ag],(ulong)borg_tp_other_x[(int)ag]);
                    borg_note(what);
                  }
                  borg_note("# Attempting to cast T.O. for depth 100.");
                  _Var2 = borg_spell(TELEPORT_OTHER);
                  if (((_Var2) || (_Var2 = borg_activate_item(act_tele_other), _Var2)) ||
                     (_Var2 = borg_aim_wand(sv_wand_teleport_away), _Var2)) {
                    borg_keypress(0x35);
                    successful_target = L'\xffffffff';
                    fail_allowed = i;
                  }
                  else {
                    fail_allowed = L'\0';
                  }
                }
                else {
                  fail_allowed = i;
                }
              }
            }
          }
        }
        else {
          fail_allowed = L'\0';
        }
      }
      else {
        fail_allowed = L'\0';
      }
    }
    else {
      fail_allowed = L'\0';
    }
  }
  else {
    fail_allowed = L'\0';
  }
  return fail_allowed;
}

Assistant:

static int borg_defend_aux_tele_away_morgoth(void)
{
    int p2           = 0;
    int fail_allowed = 40;
    int i;

    borg_grid *ag;

    /* Only if on level 100 */
    if (!(borg.trait[BI_CDEPTH] == 100))
        return 0;

    /* Not if Morgoth is not on this level */
    if (!morgoth_on_level)
        return 0;

    /* Cant when screwed */
    if (borg.trait[BI_ISBLIND] || borg.trait[BI_ISCONFUSED]
        || borg.trait[BI_ISFORGET])
        return 0;

    /* Do I have the T.O. spell? */
    if (!borg_spell_okay_fail(TELEPORT_OTHER, fail_allowed))
        return 0;

    /* Do I have the Glyph spell? No good to use TO if I cant build the sea of
     * runes */
    if (borg.trait[BI_AGLYPH] < 10)
        return 0;

    /* No Teleport Other if surrounded */
    if (borg_surrounded() == true)
        return 0;

    /* Borg_temp_n temporarily stores several things.
     * Some of the borg_attack() sub-routines use these numbers,
     * which would have been filled in borg_attack().
     * Since this is a defense maneuver which will move into
     * and borrow some of the borg_attack() subroutines, we need
     * to make sure that the borg_temp_n arrays are properly
     * filled.  Otherwise, the borg will attempt to consider
     * these grids which were left filled by some other routine.
     * Which was probably a flow routine which stored about 200
     * grids into the array.
     * Any change in inclusion/exclusion criteria for filling this
     * array in borg_attack() should be included here also.
     */

    /* Nobody around so dont worry */
    if (!borg_kills_cnt && borg_simulate)
        return 0;

    /* Reset list */
    borg_temp_n     = 0;
    borg_tp_other_n = 0;

    /* Find "nearby" monsters */
    for (i = 0; i < borg_kills_nxt; i++) {
        borg_kill *kill;

        /* Monster */
        kill = &borg_kills[i];

        /* Skip dead monsters */
        if (!kill->r_idx)
            continue;

        /* Require current knowledge */
        if (kill->when < borg_t - 2)
            continue;

        /* Get grid */
        ag = &borg_grids[kill->pos.y][kill->pos.x];

        /* Never shoot off-screen */
        if (!(ag->info & BORG_OKAY))
            continue;

        /* Never shoot through walls */
        if (!(ag->info & BORG_VIEW))
            continue;

        /* Check the distance XXX XXX XXX */
        if (distance(borg.c, kill->pos) > z_info->max_range)
            continue;

        /* Check the LOS */
        if (!borg_projectable(borg.c.y, borg.c.x, kill->pos.y, kill->pos.x))
            continue;

        /* Save the location (careful) */
        borg_temp_x[borg_temp_n] = kill->pos.x;
        borg_temp_y[borg_temp_n] = kill->pos.y;
        borg_temp_n++;
    }

    /* No destinations */
    if (!borg_temp_n && borg_simulate)
        return 0;

    /* choose then target a bad guy or several
     * If left as bolt, he targets the single most nasty guy.
     * If left as beam, he targets the collection of monsters.
     */
    p2 = borg_launch_bolt(
        0, 50, BORG_ATTACK_AWAY_ALL_MORGOTH, z_info->max_range, 0);

    /* Normalize the value a bit */
    if (p2 > 1000)
        p2 = 1000;

    /* Reset list */
    borg_temp_n     = 0;
    borg_tp_other_n = 0;

    /* Return a good score to make him do it */
    if (borg_simulate)
        return (p2);

    /* Log the Path for Debug */
    borg_log_spellpath(true);

    /* Log additional info for debug */
    for (i = 0; i < borg_tp_other_n; i++) {
        borg_note(format("# %d, index %d (%d,%d)", borg_tp_other_n,
            borg_tp_other_index[i], borg_tp_other_y[i], borg_tp_other_x[i]));
    }

    borg_note("# Attempting to cast T.O. for depth 100.");

    /* Cast the spell */
    if (borg_spell(TELEPORT_OTHER) || borg_activate_item(act_tele_other)
        || borg_aim_wand(sv_wand_teleport_away)) {
        /* Use target */
        borg_keypress('5');

        /* Set our shooting flag */
        successful_target = -1;

        /* Value */
        return (p2);
    }

    return 0;
}